

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O2

err_t cmdSigVerify(char *name,char *sig_name,octet *pubkey,size_t pubkey_len)

{
  octet *poVar1;
  bool_t bVar2;
  err_t eVar3;
  cmd_sig_t *sig;
  size_t sVar4;
  char *oid;
  octet *poVar5;
  bign_params *params;
  ulong uVar6;
  octet *poVar7;
  size_t oid_len;
  octet *local_68;
  size_t drop;
  bign_params *local_58;
  octet *local_50;
  octet *local_48;
  size_t cert_len;
  size_t offset;
  
  oid_len = 0x10;
  bVar2 = strIsValid(name);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = strIsValid(sig_name);
  if (bVar2 == 0) {
    return 0x6d;
  }
  uVar6 = pubkey_len - 0x30 >> 4;
  if (5 < (pubkey_len << 0x3c | uVar6)) {
    return 0x6d;
  }
  if ((0x2bUL >> (uVar6 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  bVar2 = memIsValid(pubkey,pubkey_len);
  if (bVar2 == 0) {
    return 0x6d;
  }
  uVar6 = pubkey_len >> 1;
  sig = (cmd_sig_t *)blobCreate(uVar6 + 0x8b8);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  local_68 = pubkey;
  eVar3 = cmdSigRead(sig,&drop,sig_name);
  if (eVar3 != 0) goto LAB_00106780;
  bVar2 = cmdFileAreSame(name,sig_name);
  if (bVar2 == 0) {
    sVar4 = cmdFileSize(sig_name);
    if (drop != sVar4) {
      blobClose(sig);
      return 0x132;
    }
    drop = 0;
  }
  local_50 = sig->certs;
  poVar1 = sig->date;
  eVar3 = cmdCVCsVal(local_50,sig->certs_len,poVar1);
  poVar7 = local_50;
  poVar5 = local_68;
  if ((eVar3 != 0) ||
     ((local_48 = poVar1, sig->certs_len != 0 &&
      ((((eVar3 = cmdCVCsGetLast(&offset,&cert_len,local_50,sig->certs_len), eVar3 != 0 ||
         (eVar3 = btokCVCUnwrap((btok_cvc_t *)(sig + 1),poVar7 + offset,cert_len,(octet *)0x0,0),
         eVar3 != 0)) || (eVar3 = 0x1f9, *(size_t *)(sig[1].certs + 0x38) != pubkey_len)) ||
       (bVar2 = memEq(poVar5,sig[1].sig + 0x1a,pubkey_len), bVar2 == 0)))))) goto LAB_00106780;
  eVar3 = cmdSigParamsStd((bign_params *)(sig[1].certs + 0xc0),uVar6);
  if (eVar3 != 0) goto LAB_00106780;
  poVar1 = sig[1].certs + 0x220;
  local_58 = (bign_params *)(sig[1].certs + 0xc0);
  eVar3 = cmdSigHash(poVar1,uVar6,name,drop,local_50,sig->certs_len,local_48);
  if (eVar3 != 0) goto LAB_00106780;
  poVar5 = sig[1].certs + 0x210;
  if (pubkey_len < 0x41) {
    eVar3 = bignOidToDER(poVar5,&oid_len,"1.2.112.0.2.0.34.101.31.81");
    params = local_58;
    poVar7 = local_68;
    if (eVar3 != 0) goto LAB_00106780;
    if (pubkey_len != 0x30) goto LAB_0010690f;
    eVar3 = bign96PubkeyVal(local_58,local_68);
    if (eVar3 != 0) goto LAB_00106780;
  }
  else {
    oid = "1.2.112.0.2.0.34.101.77.13";
    if (pubkey_len == 0x60) {
      oid = "1.2.112.0.2.0.34.101.77.12";
    }
    eVar3 = bignOidToDER(poVar5,&oid_len,oid);
    if (eVar3 != 0) goto LAB_00106780;
LAB_0010690f:
    params = local_58;
    poVar7 = local_68;
    eVar3 = bignPubkeyVal(local_58,local_68);
    if (eVar3 != 0) goto LAB_00106780;
    if (pubkey_len != 0x30) {
      eVar3 = bignVerify(params,poVar5,oid_len,poVar1,(octet *)sig,poVar7);
      goto LAB_00106780;
    }
  }
  eVar3 = bign96Verify(params,poVar5,oid_len,poVar1,(octet *)sig,poVar7);
LAB_00106780:
  blobClose(sig);
  return eVar3;
}

Assistant:

err_t cmdSigVerify(const char* name, const char* sig_name,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	btok_cvc_t* cvc;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	size_t drop;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(sig_name) ||
		!(pubkey_len == 48 || pubkey_len == 64 || pubkey_len == 96 || 
			pubkey_len == 128) ||
		!memIsValid(pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t) + sizeof(btok_cvc_t) +
		sizeof(bign_params) + oid_len + pubkey_len / 2);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	cvc = (btok_cvc_t*)(sig + 1);
	params = (bign_params*)(cvc + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + oid_len;
	// читать подпись
	code = cmdSigRead(sig, &drop, sig_name);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// подпись в отдельном файле?
	if (!cmdFileAreSame(name, sig_name))
	{
		code = drop == cmdFileSize(sig_name) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		drop = 0;
	}
	// проверить сертификаты
	code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);	
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// есть сертификаты?
	if (sig->certs_len)
	{
		size_t offset;
		size_t cert_len;
		// найти и разобрать последний сертификат
		code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		code = btokCVCUnwrap(cvc, sig->certs + offset, cert_len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить открытый ключ последнего сертификата
		if (pubkey_len != cvc->pubkey_len ||
			!memEq(pubkey, cvc->pubkey, pubkey_len))
			code = ERR_BAD_PUBKEY;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, pubkey_len / 2);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, pubkey_len / 2, name, drop, sig->certs, 
		sig->certs_len, sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (pubkey_len <= 64)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (pubkey_len == 48)
		code = bign96PubkeyVal(params, pubkey);
	else
		code = bignPubkeyVal(params, pubkey);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить подпись
	if (pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig->sig, pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig->sig, pubkey);
	// завершить
	cmdBlobClose(stack);
	return code;
}